

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
AddAnnotationNew(AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,Annotation *a)

{
  string_view data;
  GeneratedCodeInfo_Annotation *this_00;
  GeneratedCodeInfo_Annotation *annotation;
  Annotation *a_local;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this_local;
  
  this_00 = GeneratedCodeInfo::add_annotation(this->annotation_proto_);
  data = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&a->second)
  ;
  MessageLite::ParseFromString((MessageLite *)this_00,data);
  GeneratedCodeInfo_Annotation::set_begin(this_00,(int32_t)(a->first).first);
  GeneratedCodeInfo_Annotation::set_end(this_00,(int32_t)(a->first).second);
  return;
}

Assistant:

void AddAnnotationNew(Annotation& a) override {
    auto* annotation = annotation_proto_->add_annotation();
    annotation->ParseFromString(a.second);
    annotation->set_begin(a.first.first);
    annotation->set_end(a.first.second);
  }